

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O0

void __thiscall libDAI::FactorGraph::backupFactor(FactorGraph *this,size_t I)

{
  bool bVar1;
  undefined8 uVar2;
  TFactor<double> *x;
  undefined8 in_RSI;
  long *in_RDI;
  string *unaff_retaddr;
  size_t in_stack_00000008;
  Exception *in_stack_00000010;
  iterator it;
  map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
  *in_stack_ffffffffffffff88;
  TFactor<double> *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0xb3d309);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator!=(&local_18,&local_20);
  if (!bVar1) {
    x = (TFactor<double> *)(**(code **)(*in_RDI + 0x50))(in_RDI,local_10);
    std::
    map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
    ::operator[]((map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    TFactor<double>::operator=(in_stack_ffffffffffffff90,x);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  Exception::Exception(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  __cxa_throw(uVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void FactorGraph::backupFactor( size_t I ) {
        map<size_t,Factor>::iterator it = _backupFactors.find( I );
        if( it != _backupFactors.end() )
            DAI_THROW( MULTIPLE_UNDO );
        _backupFactors[I] = factor(I);
    }